

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceRangeCString_success_nullptrReplaceArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"012xxx34",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_replaceRangeCString(&string,0x29a,0x2a,(char *)0x0,3);
  if (bVar1 == false) {
    pcVar3 = "Assertion \'AString_replaceRangeCString(&string, 666, 42, ((void*)0), 3)\' failed";
    iVar2 = 0x5e0;
LAB_001370a5:
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar3,0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e0);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e1);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      string.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (string).buffer != NULL";
      pcVar6 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e1);
      pcVar4 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar4 = "(null)";
      }
      else {
        iVar2 = strcmp("012xxx34",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e1);
          if (string.size != 8) {
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).size == strlen(\"012xxx34\")";
            pcVar6 = "(string).size";
            string.buffer = "strlen(\"012xxx34\")";
            goto LAB_00136d28;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e1);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            string.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x5e2;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_001371d5;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e2);
          bVar1 = AString_replaceRangeCString(&string,3,3,(char *)0x0,3);
          if (bVar1 == false) {
            pcVar3 = 
            "Assertion \'AString_replaceRangeCString(&string, 3, 3, ((void*)0), 3)\' failed";
            iVar2 = 0x5e3;
            goto LAB_001370a5;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e3);
          if (string.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x5e4);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              string.buffer = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (string).buffer != NULL";
              pcVar6 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x5e4);
              pcVar4 = string.buffer;
              if (string.buffer == (char *)0x0) {
                string.size = 0x16819b;
                pcVar4 = "(null)";
              }
              else {
                iVar2 = strcmp("01234",string.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x5e4);
                  if (string.size != 5) {
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(string).size == strlen(\"01234\")";
                    pcVar6 = "(string).size";
                    string.buffer = "strlen(\"01234\")";
                    goto LAB_00136eb9;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x5e4);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    string.buffer = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x5e5;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_001371d5;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x5e5);
                  bVar1 = AString_replaceRangeCString(&string,3,0x29a,(char *)0x0,3);
                  if (bVar1 == false) {
                    pcVar3 = 
                    "Assertion \'AString_replaceRangeCString(&string, 3, 666, ((void*)0), 3)\' failed"
                    ;
                    iVar2 = 0x5e6;
                    goto LAB_001370a5;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x5e6);
                  if (string.capacity == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x5e7);
                    if (string.buffer == (char *)0x0) {
                      string.size = 0;
                      string.buffer = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar5 = "(void*) (string).buffer != NULL";
                      pcVar6 = "(void*) (string).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x5e7);
                      pcVar4 = string.buffer;
                      if (string.buffer == (char *)0x0) {
                        string.size = 0x16819b;
                        pcVar4 = "(null)";
                      }
                      else {
                        iVar2 = strcmp("012",string.buffer);
                        if (iVar2 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x5e7);
                          if (string.size != 3) {
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(string).size == strlen(\"012\")";
                            pcVar6 = "(string).size";
                            string.buffer = "strlen(\"012\")";
                            goto LAB_0013704a;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x5e7);
                          if (private_ACUtilsTest_AString_reallocCount != 0) {
                            string.buffer = "(0)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                            pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                            iVar2 = 0x5e8;
                            string.size = private_ACUtilsTest_AString_reallocCount;
                            goto LAB_001371d5;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x5e8);
                          bVar1 = AString_replaceRangeCString(&string,0,4,(char *)0x0,3);
                          if (bVar1 == false) {
                            pcVar3 = 
                            "Assertion \'AString_replaceRangeCString(&string, 0, 4, ((void*)0), 3)\' failed"
                            ;
                            iVar2 = 0x5e9;
                            goto LAB_001370a5;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x5e9);
                          if (string.capacity == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x5ea);
                            if (string.buffer == (char *)0x0) {
                              string.size = 0;
                              string.buffer = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar5 = "(void*) (string).buffer != NULL";
                              pcVar6 = "(void*) (string).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x5ea);
                              if (string.buffer == (char *)0x0) {
                                string.buffer = "(null)";
                                string.size = 0x16819b;
                              }
                              else {
                                if (*string.buffer == '\0') {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x5ea);
                                  if (string.size == 0) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x5ea);
                                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x5eb);
                                      (*string.deallocator)(string.buffer);
                                      return;
                                    }
                                    string.buffer = "(0)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "private_ACUtilsTest_AString_reallocCount == (0)";
                                    pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                                    iVar2 = 0x5eb;
                                    string.size = private_ACUtilsTest_AString_reallocCount;
                                    goto LAB_001371d5;
                                  }
                                  string.buffer = "strlen(\"\")";
                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                  pcVar5 = "(string).size == strlen(\"\")";
                                  pcVar6 = "(string).size";
                                  goto LAB_001371d0;
                                }
                                string.size = 0x15c553;
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar5 = "(string).buffer == (\"\")";
                              pcVar6 = "(string).buffer";
                            }
                          }
                          else {
                            string.buffer = "(8)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(string).capacity == (8)";
                            pcVar6 = "(string).capacity";
                            string.size = string.capacity;
                          }
LAB_001371d0:
                          iVar2 = 0x5ea;
                          goto LAB_001371d5;
                        }
                        string.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar5 = "(string).buffer == (\"012\")";
                      pcVar6 = "(string).buffer";
                      string.buffer = pcVar4;
                    }
                  }
                  else {
                    string.buffer = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(string).capacity == (8)";
                    pcVar6 = "(string).capacity";
                    string.size = string.capacity;
                  }
LAB_0013704a:
                  iVar2 = 0x5e7;
                  goto LAB_001371d5;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(string).buffer == (\"01234\")";
              pcVar6 = "(string).buffer";
              string.buffer = pcVar4;
            }
          }
          else {
            string.buffer = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).capacity == (8)";
            pcVar6 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_00136eb9:
          iVar2 = 0x5e4;
          goto LAB_001371d5;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(string).buffer == (\"012xxx34\")";
      pcVar6 = "(string).buffer";
      string.buffer = pcVar4;
    }
  }
  else {
    string.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(string).capacity == (8)";
    pcVar6 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_00136d28:
  iVar2 = 0x5e1;
LAB_001371d5:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar6,string.size,string.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_nullptrReplaceArray)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012xxx34", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 666, 42, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012xxx34", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 3, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 666, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 0, 4, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}